

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

bool __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd
          (basic_random_coro_file<(coro_io::execution_type)2> *this,string_view filepath,
          int open_flags)

{
  bool bVar1;
  const_pointer __file;
  int *piVar2;
  int in_ECX;
  shared_ptr<int> *in_RDI;
  int fd;
  shared_ptr<int> *in_stack_ffffffffffffffc0;
  shared_ptr<int> local_38;
  int local_28;
  int local_24;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  local_24 = in_ECX;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 3));
  if (bVar1) {
    local_1 = true;
  }
  else {
    __file = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    local_28 = ::open(__file,local_24);
    if (local_28 < 0) {
      local_1 = false;
    }
    else {
      piVar2 = (int *)operator_new(4);
      *piVar2 = local_28;
      std::shared_ptr<int>::
      shared_ptr<int,coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd(std::basic_string_view<char,std::char_traits<char>>,int)::_lambda(int*)_1_,void>
                (&local_38);
      std::shared_ptr<int>::operator=(in_stack_ffffffffffffffc0,in_RDI);
      std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x1a22a9);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool open_fd(std::string_view filepath, int open_flags) {
    if (prw_random_file_) {
      return true;
    }

#if defined(ASIO_WINDOWS)
    int fd = _open(filepath.data(), adjust_flags(open_flags));
#else
    int fd = ::open(filepath.data(), open_flags);
#endif
    if (fd < 0) {
      return false;
    }

    prw_random_file_ = std::shared_ptr<int>(new int(fd), [](int *ptr) {
#if defined(ASIO_WINDOWS)
      _close(*ptr);
#else
      ::close(*ptr);
#endif
      delete ptr;
    });
    return true;
  }